

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int local_1c;
  int i;
  char **argv_local;
  int argc_local;
  
  if (argc == 1) {
    argv_local._4_4_ = main_repl(1,argv);
  }
  else {
    for (local_1c = 1; local_1c < argc; local_1c = local_1c + 1) {
      iVar1 = run(argv[local_1c]);
      if (iVar1 != 0) {
        return -1;
      }
    }
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {

  if (argc == 1) {
    return main_repl(argc, argv);
  }

  for (int i = 1; i < argc; ++i) {
    if (run(argv[i]) != 0) {
      return -1;
    }
  }
  return 0;
}